

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O2

int mbedtls_pk_write_pubkey(uchar **p,uchar *start,mbedtls_pk_context *key)

{
  mbedtls_rsa_context *ctx;
  mbedtls_pk_type_t mVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong len;
  mbedtls_mpi mStack_48;
  
  mVar1 = mbedtls_pk_get_type(key);
  if (mVar1 == MBEDTLS_PK_RSA) {
    ctx = (mbedtls_rsa_context *)key->pk_ctx;
    mbedtls_mpi_init(&mStack_48);
    len = 0;
    uVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                               (mbedtls_mpi *)0x0,&mStack_48);
    if ((uVar2 == 0) &&
       (uVar2 = mbedtls_asn1_write_mpi(p,start,&mStack_48), len = 0, -1 < (int)uVar2)) {
      uVar3 = mbedtls_rsa_export(ctx,&mStack_48,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                 (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
      if (uVar3 == 0) {
        uVar5 = mbedtls_asn1_write_mpi(p,start,&mStack_48);
        uVar3 = 0;
        if (0 < (int)uVar5) {
          uVar3 = uVar5;
        }
        len = (ulong)(uVar3 + uVar2);
        uVar2 = uVar5;
      }
      else {
        len = (ulong)uVar2;
        uVar2 = uVar3;
      }
    }
    mbedtls_mpi_free(&mStack_48);
    if (-1 < (int)uVar2) {
      uVar3 = mbedtls_asn1_write_len(p,start,len);
      uVar2 = uVar3;
      if ((-1 < (int)uVar3) && (uVar2 = mbedtls_asn1_write_tag(p,start,'0'), -1 < (int)uVar2)) {
        uVar2 = uVar3 + (int)len + uVar2;
      }
    }
  }
  else {
    mVar1 = mbedtls_pk_get_type(key);
    uVar2 = 0xffffc680;
    if (mVar1 == MBEDTLS_PK_ECKEY) {
      iVar4 = pk_write_ec_pubkey(p,start,(mbedtls_ecp_keypair *)key->pk_ctx);
      return iVar4;
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_pk_write_pubkey( unsigned char **p, unsigned char *start,
                             const mbedtls_pk_context *key )
{
    int ret;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_rsa_pubkey( p, start, mbedtls_pk_rsa( *key ) ) );
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
        MBEDTLS_ASN1_CHK_ADD( len, pk_write_ec_pubkey( p, start, mbedtls_pk_ec( *key ) ) );
    else
#endif
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}